

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcache.c
# Opt level: O2

_Bool duckdb_je_tcaches_create(tsd_t *tsd,base_t *base,uint *r_ind)

{
  anon_union_8_2_150e8edc_for_tcaches_s_0 *paVar1;
  tcaches_t *ptVar2;
  tcaches_t tVar3;
  _Bool _Var4;
  
  malloc_mutex_lock((tsdn_t *)tsd,&tcaches_mtx);
  if (duckdb_je_tcaches == (tcaches_t *)0x0) {
    duckdb_je_tcaches = (tcaches_t *)duckdb_je_base_alloc((tsdn_t *)tsd,base,0x7ff0,0x40);
    if (duckdb_je_tcaches == (tcaches_t *)0x0) {
      _Var4 = true;
      goto LAB_00e779a7;
    }
  }
  _Var4 = true;
  if ((tcaches_avail != (tcaches_t *)0x0) || (tcaches_past < 0xffe)) {
    tVar3.field_0 = (anon_union_8_2_150e8edc_for_tcaches_s_0)duckdb_je_tcache_create_explicit(tsd);
    ptVar2 = tcaches_avail;
    if (tVar3.field_0 != (tcache_t *)0x0) {
      if (tcaches_avail == (tcaches_t *)0x0) {
        duckdb_je_tcaches[tcaches_past].field_0.tcache = (tcache_t *)tVar3.field_0;
        *r_ind = tcaches_past;
        tcaches_past = tcaches_past + 1;
      }
      else {
        paVar1 = &tcaches_avail->field_0;
        tcaches_avail = (tcaches_avail->field_0).next;
        paVar1->tcache = (tcache_t *)tVar3;
        *r_ind = (uint)((ulong)((long)ptVar2 - (long)duckdb_je_tcaches) >> 3);
      }
      _Var4 = false;
    }
  }
LAB_00e779a7:
  tcaches_mtx.field_0.field_0.locked.repr = (atomic_b_t)false;
  pthread_mutex_unlock((pthread_mutex_t *)((long)&tcaches_mtx.field_0 + 0x48));
  return _Var4;
}

Assistant:

bool
tcaches_create(tsd_t *tsd, base_t *base, unsigned *r_ind) {
	witness_assert_depth(tsdn_witness_tsdp_get(tsd_tsdn(tsd)), 0);

	bool err;

	malloc_mutex_lock(tsd_tsdn(tsd), &tcaches_mtx);

	if (tcaches_create_prep(tsd, base)) {
		err = true;
		goto label_return;
	}

	tcache_t *tcache = tcache_create_explicit(tsd);
	if (tcache == NULL) {
		err = true;
		goto label_return;
	}

	tcaches_t *elm;
	if (tcaches_avail != NULL) {
		elm = tcaches_avail;
		tcaches_avail = tcaches_avail->next;
		elm->tcache = tcache;
		*r_ind = (unsigned)(elm - tcaches);
	} else {
		elm = &tcaches[tcaches_past];
		elm->tcache = tcache;
		*r_ind = tcaches_past;
		tcaches_past++;
	}

	err = false;
label_return:
	malloc_mutex_unlock(tsd_tsdn(tsd), &tcaches_mtx);
	witness_assert_depth(tsdn_witness_tsdp_get(tsd_tsdn(tsd)), 0);
	return err;
}